

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int mbedtls_sha256_self_test(int verbose)

{
  uint is224;
  uchar *input;
  int iVar1;
  undefined1 local_c4 [8];
  mbedtls_sha256_context ctx;
  uchar sha256sum [32];
  uchar *buf;
  int ret;
  int buflen;
  int k;
  int j;
  int i;
  int verbose_local;
  
  buf._4_4_ = 0;
  input = (uchar *)calloc(0x400,1);
  if (input == (uchar *)0x0) {
    if (verbose != 0) {
      printf("Buffer allocation failed\n");
    }
    i = 1;
  }
  else {
    mbedtls_sha256_init((mbedtls_sha256_context *)local_c4);
    for (k = 0; k < 6; k = k + 1) {
      iVar1 = k % 3;
      is224 = (uint)(k < 3);
      if (verbose != 0) {
        printf("  SHA-%d test #%d: ",(ulong)(is224 * -0x20 + 0x100),(ulong)(iVar1 + 1));
      }
      buf._4_4_ = mbedtls_sha256_starts_ret((mbedtls_sha256_context *)local_c4,is224);
      if (buf._4_4_ != 0) {
LAB_0012a048:
        if (verbose != 0) {
          printf("failed\n");
        }
        goto LAB_0012a05e;
      }
      if (iVar1 == 2) {
        memset(input,0x61,1000);
        for (buflen = 0; buflen < 1000; buflen = buflen + 1) {
          buf._4_4_ = mbedtls_sha256_update_ret((mbedtls_sha256_context *)local_c4,input,1000);
          if (buf._4_4_ != 0) goto LAB_0012a048;
        }
      }
      else {
        buf._4_4_ = mbedtls_sha256_update_ret
                              ((mbedtls_sha256_context *)local_c4,sha256_test_buf[iVar1],
                               sha256_test_buflen[iVar1]);
        if (buf._4_4_ != 0) goto LAB_0012a048;
      }
      buf._4_4_ = mbedtls_sha256_finish_ret((mbedtls_sha256_context *)local_c4,ctx.buffer + 0x3c);
      if (buf._4_4_ != 0) goto LAB_0012a048;
      iVar1 = memcmp(ctx.buffer + 0x3c,sha256_test_sum + k,(long)(int)(is224 * -4 + 0x20));
      if (iVar1 != 0) {
        buf._4_4_ = 1;
        goto LAB_0012a048;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
    }
    if (verbose != 0) {
      printf(anon_var_dwarf_17d4d + 8);
    }
LAB_0012a05e:
    mbedtls_sha256_free((mbedtls_sha256_context *)local_c4);
    free(input);
    i = buf._4_4_;
  }
  return i;
}

Assistant:

int mbedtls_sha256_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char *buf;
    unsigned char sha256sum[32];
    mbedtls_sha256_context ctx;

    buf = mbedtls_calloc( 1024, sizeof(unsigned char) );
    if( NULL == buf )
    {
        if( verbose != 0 )
            mbedtls_printf( "Buffer allocation failed\n" );

        return( 1 );
    }

    mbedtls_sha256_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 256 - k * 32, j + 1 );

        if( ( ret = mbedtls_sha256_starts_ret( &ctx, k ) ) != 0 )
            goto fail;

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
            {
                ret = mbedtls_sha256_update_ret( &ctx, buf, buflen );
                if( ret != 0 )
                    goto fail;
            }

        }
        else
        {
            ret = mbedtls_sha256_update_ret( &ctx, sha256_test_buf[j],
                                             sha256_test_buflen[j] );
            if( ret != 0 )
                 goto fail;
        }

        if( ( ret = mbedtls_sha256_finish_ret( &ctx, sha256sum ) ) != 0 )
            goto fail;


        if( memcmp( sha256sum, sha256_test_sum[i], 32 - k * 4 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    goto exit;

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

exit:
    mbedtls_sha256_free( &ctx );
    mbedtls_free( buf );

    return( ret );
}